

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadFunction(LoadState *S,Proto *fp,TString *psource)

{
  SharedProto *f_00;
  lu_byte lVar1;
  int iVar2;
  TString *pTVar3;
  SharedProto *f;
  TString *psource_local;
  Proto *fp_local;
  LoadState *S_local;
  
  f_00 = fp->sp;
  pTVar3 = LoadString(S);
  f_00->source = pTVar3;
  if (f_00->source == (TString *)0x0) {
    f_00->source = psource;
  }
  iVar2 = LoadInt(S);
  f_00->linedefined = iVar2;
  iVar2 = LoadInt(S);
  f_00->lastlinedefined = iVar2;
  lVar1 = LoadByte(S);
  f_00->numparams = lVar1;
  lVar1 = LoadByte(S);
  f_00->is_vararg = lVar1;
  lVar1 = LoadByte(S);
  f_00->maxstacksize = lVar1;
  LoadCode(S,f_00);
  LoadConstants(S,fp);
  LoadUpvalues(S,f_00);
  LoadProtos(S,fp);
  LoadDebug(S,f_00);
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *fp, TString *psource) {
  SharedProto *f = fp->sp;
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, fp);
  LoadUpvalues(S, f);
  LoadProtos(S, fp);
  LoadDebug(S, f);
}